

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O2

void olsrv2_lan_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = _lan_tree.list_head.next;
  while (plVar2->prev != _lan_tree.list_head.prev) {
    plVar1 = plVar2->next;
    _remove((char *)&plVar2[-3].prev);
    plVar2 = plVar1;
  }
  oonf_class_remove(&_lan_class);
  return;
}

Assistant:

void
olsrv2_lan_cleanup(void) {
  struct olsrv2_lan_entry *entry, *e_it;

  /* remove all originator entries */
  avl_for_each_element_safe(&_lan_tree, entry, _node, e_it) {
    _remove(entry);
  }

  /* remove class */
  oonf_class_remove(&_lan_class);
}